

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::TensorValue_RepeatedBytes
          (TensorValue_RepeatedBytes *this,TensorValue_RepeatedBytes *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TensorValue_RepeatedBytes_003fa7e0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (this_00,&(from->super_MessageLite)._internal_metadata_);
  (this->values_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->values_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = this_00->ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->values_,uVar3,puVar2);
  }
  return;
}

Assistant:

TensorValue_RepeatedBytes::TensorValue_RepeatedBytes(const TensorValue_RepeatedBytes& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  values_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    values_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_values().empty()) {
    values_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_values(), 
      GetArenaForAllocation());
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.TensorValue.RepeatedBytes)
}